

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintStatement.h
# Opt level: O3

void __thiscall PrintStatement::execute(PrintStatement *this,Environment *env)

{
  element_type *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 *puVar6;
  ptr<Value> value;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  peVar1 = (this->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(0x10,0,env);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Value is null","");
    ExceptionObjects::null_value((ExceptionObjects *)&local_38,&local_68);
    uVar2 = (undefined4)local_38;
    uVar3 = local_38._4_4_;
    uVar4 = (undefined4)uStack_30;
    uVar5 = uStack_30._4_4_;
    local_38 = 0;
    uStack_30 = 0;
    *puVar6 = uVar2;
    puVar6[1] = uVar3;
    puVar6[2] = uVar4;
    puVar6[3] = uVar5;
    __cxa_throw(puVar6,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
  }
  (**peVar1->_vptr_Expression)(&local_28);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 0x10))(&local_68);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_68._M_dataplus._M_p,local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    return;
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Value is null","");
  ExceptionObjects::null_value((ExceptionObjects *)&local_48,&local_68);
  uVar2 = (undefined4)local_48;
  uVar3 = local_48._4_4_;
  uVar4 = (undefined4)uStack_40;
  uVar5 = uStack_40._4_4_;
  local_48 = 0;
  uStack_40 = 0;
  *puVar6 = uVar2;
  puVar6[1] = uVar3;
  puVar6[2] = uVar4;
  puVar6[3] = uVar5;
  __cxa_throw(puVar6,&ThrowPacket::typeinfo,CarrierPacket::~CarrierPacket);
}

Assistant:

void execute(Environment *env) override {
        if(!expression)
            throw ThrowPacket(ExceptionObjects::null_value("Value is null"));
        ptr<Value> value = expression -> evaluate(env);
        if(!value)
            throw ThrowPacket(ExceptionObjects::null_value("Value is null"));

        std::cout << value -> asString();
    }